

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase183::run(TestCase183 *this)

{
  char *pcVar1;
  long *plVar2;
  char *pcVar3;
  unsigned_long uVar4;
  ArrayPtr<char> AVar5;
  unsigned_long local_58 [2];
  Arena arena;
  
  Arena::Arena(&arena,0x400);
  pcVar1 = Arena::allocate<char>(&arena);
  plVar2 = Arena::allocate<long>(&arena);
  pcVar3 = Arena::allocate<char>(&arena);
  AVar5 = Arena::allocateArray<char>(&arena,8);
  if ((long)pcVar3 - (long)pcVar1 != 0x10 && _::Debug::minSeverity < 3) {
    local_58[1] = 0x10;
    local_58[0] = (long)pcVar3 - (long)pcVar1;
    _::Debug::log<char_const(&)[84],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xbf,ERROR,
               "\"failed: expected \" \"(alignof(long) + sizeof(long)) == (implicitCast<size_t>(&c2 - &c))\", alignof(long) + sizeof(long), implicitCast<size_t>(&c2 - &c)"
               ,(char (*) [84])
                "failed: expected (alignof(long) + sizeof(long)) == (implicitCast<size_t>(&c2 - &c))"
               ,local_58 + 1,local_58);
  }
  if (_::Debug::minSeverity < 3 && (long)plVar2 - (long)pcVar1 != 8) {
    local_58[1] = 8;
    local_58[0] = (long)plVar2 - (long)pcVar1;
    _::Debug::log<char_const(&)[93],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xc0,ERROR,
               "\"failed: expected \" \"(alignof(long)) == (implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c))\", alignof(long), implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c)"
               ,(char (*) [93])
                "failed: expected (alignof(long)) == (implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c))"
               ,local_58 + 1,local_58);
  }
  uVar4 = (long)AVar5.ptr - (long)pcVar3;
  if ((uVar4 != 1) && (_::Debug::minSeverity < 3)) {
    local_58[1] = 1;
    local_58[0] = uVar4;
    _::Debug::log<char_const(&)[77],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xc1,ERROR,
               "\"failed: expected \" \"(sizeof(char)) == (implicitCast<size_t>(arr.begin() - &c2))\", sizeof(char), implicitCast<size_t>(arr.begin() - &c2)"
               ,(char (*) [77])
                "failed: expected (sizeof(char)) == (implicitCast<size_t>(arr.begin() - &c2))",
               local_58 + 1,local_58);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, Alignment) {
  Arena arena;

  char& c = arena.allocate<char>();
  long& l = arena.allocate<long>();
  char& c2 = arena.allocate<char>();
  ArrayPtr<char> arr = arena.allocateArray<char>(8);

  EXPECT_EQ(alignof(long) + sizeof(long), implicitCast<size_t>(&c2 - &c));
  EXPECT_EQ(alignof(long), implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c));
  EXPECT_EQ(sizeof(char), implicitCast<size_t>(arr.begin() - &c2));
}